

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_suite.hpp
# Opt level: O0

char * __thiscall test_suite::detail::simple_runner::filename(simple_runner *this,char *file)

{
  char *pcVar1;
  size_t sVar2;
  char *local_28;
  char *p;
  char *p0;
  char *file_local;
  simple_runner *this_local;
  
  sVar2 = strlen(file);
  pcVar1 = file + sVar2;
  do {
    local_28 = pcVar1;
    if (local_28 == file) {
      return local_28;
    }
    pcVar1 = local_28 + -1;
  } while (local_28[-1] != '/');
  return local_28;
}

Assistant:

char const*
  filename(
      char const* file)
  {
    auto const p0 = file;
    auto p = p0 + std::strlen(file);
    while(p-- != p0)
    {
#ifdef _MSC_VER
      if(*p == '\\')
#else
      if(*p == '/')
#endif
        break;
    }
    return p + 1;
  }